

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

void __thiscall
wasm::Wasm2JSBuilder::processFunctionBody(wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::
ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
          (void *this,Type type,Wasm2JSBuilder *parent,Function *func,IString possible)

{
  bool bVar1;
  string_view local_48;
  Function *local_38;
  Function *func_local;
  Wasm2JSBuilder *parent_local;
  ScopedTemp *this_local;
  IString possible_local;
  Type type_local;
  
  possible_local.str._M_len = (size_t)possible.str._M_str;
  this_local = (ScopedTemp *)possible.str._M_len;
  *(Wasm2JSBuilder **)this = parent;
  *(uintptr_t *)((long)this + 8) = type.id;
  local_38 = func;
  func_local = (Function *)parent;
  parent_local = (Wasm2JSBuilder *)this;
  possible_local.str._M_str = (char *)type.id;
  IString::IString((IString *)((long)this + 0x10));
  bVar1 = IString::operator!=((IString *)&this_local,(IString *)&EXPRESSION_RESULT);
  if (!bVar1) {
    __assert_fail("possible != EXPRESSION_RESULT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                  ,0x459,
                  "wasm::Wasm2JSBuilder::processFunctionBody(Module *, Function *, bool)::ExpressionProcessor::ScopedTemp::ScopedTemp(Type, Wasm2JSBuilder *, Function *, IString)"
                 );
  }
  bVar1 = IString::operator==((IString *)&this_local,(IString *)&NO_RESULT);
  if (bVar1) {
    local_48 = (string_view)
               getTemp((Wasm2JSBuilder *)func_local,(Type)possible_local.str._M_str,local_38);
    IString::operator=((IString *)((long)this + 0x10),(IString *)&local_48);
    *(undefined1 *)((long)this + 0x20) = 1;
  }
  else {
    IString::operator=((IString *)((long)this + 0x10),(IString *)&this_local);
    *(undefined1 *)((long)this + 0x20) = 0;
  }
  return;
}

Assistant:

ScopedTemp(Type type,
                 Wasm2JSBuilder* parent,
                 Function* func,
                 IString possible = NO_RESULT)
        : parent(parent), type(type) {
        assert(possible != EXPRESSION_RESULT);
        if (possible == NO_RESULT) {
          temp = parent->getTemp(type, func);
          needFree = true;
        } else {
          temp = possible;
          needFree = false;
        }
      }